

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-factory.cpp
# Opt level: O0

void __thiscall
dynamicgraph::ExceptionFactory::ExceptionFactory
          (ExceptionFactory *this,ErrorCodeEnum *errcode,string *msg,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_218 [32];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  char local_158 [8];
  char buffer [256];
  undefined4 local_48;
  uint SIZE;
  va_list args;
  char *format_local;
  string *msg_local;
  ErrorCodeEnum *errcode_local;
  ExceptionFactory *this_local;
  
  if (in_AL != '\0') {
    local_1e8 = in_XMM0_Qa;
    local_1d8 = in_XMM1_Qa;
    local_1c8 = in_XMM2_Qa;
    local_1b8 = in_XMM3_Qa;
    local_1a8 = in_XMM4_Qa;
    local_198 = in_XMM5_Qa;
    local_188 = in_XMM6_Qa;
    local_178 = in_XMM7_Qa;
  }
  args[0].reg_save_area._4_4_ = *errcode;
  local_1f8 = in_R8;
  local_1f0 = in_R9;
  ExceptionAbstract::ExceptionAbstract
            (&this->super_ExceptionAbstract,(int *)((long)&args[0].reg_save_area + 4),msg);
  *(undefined ***)&this->super_ExceptionAbstract = &PTR__ExceptionFactory_00195960;
  args[0].overflow_arg_area = local_218;
  args[0]._0_8_ = &stack0x00000008;
  SIZE = 0x30;
  local_48 = 0x20;
  vsnprintf(local_158,0x100,format,&local_48);
  std::__cxx11::string::operator+=((string *)&(this->super_ExceptionAbstract).message,local_158);
  return;
}

Assistant:

ExceptionFactory::ExceptionFactory(
    const ExceptionFactory::ErrorCodeEnum &errcode, const std::string &msg,
    const char *format, ...)
    : ExceptionAbstract(errcode, msg) {
  va_list args;
  va_start(args, format);

  const unsigned int SIZE = 256;
  char buffer[SIZE];
  vsnprintf(buffer, SIZE, format, args);

  dgDEBUG(15) << "Created "
              << " with message <" << msg << "> and buffer <" << buffer << ">. "
              << std::endl;

  message += buffer;

  va_end(args);

  dgDEBUG(1) << "Throw exception " << EXCEPTION_NAME << "[#" << errcode << "]: "
             << "<" << message << ">." << std::endl;
}